

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O3

FuncVec * __thiscall
dg::llvmdg::LazyLLVMCallGraph::getCalledFunctions(LazyLLVMCallGraph *this,CallInst *C)

{
  HashMap<const_llvm::CallInst_*,_FuncVec> *this_00;
  pointer ppFVar1;
  pointer ppFVar2;
  Function *pFVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  FuncVec *pFVar6;
  Function *fun;
  CallInst *local_50;
  FuncVec local_48;
  Function *local_28;
  
  local_50 = C;
  pFVar3 = (Function *)llvm::Value::stripPointerCasts();
  local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(Function *)0x0;
  if (pFVar3[0x10] == (Function)0x0) {
    local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pFVar3;
  }
  if ((Function *)
      local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start == (Function *)0x0) {
    this_00 = &this->_funptrs;
    iVar4 = std::
            _Hashtable<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this_00,&local_50);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      _getCalledFunctions(&local_48,this,local_50);
      pmVar5 = std::__detail::
               _Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_50);
      ppFVar1 = (pmVar5->
                super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      ppFVar2 = (pmVar5->
                super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pmVar5->super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
      _M_impl.super__Vector_impl_data._M_start =
           local_48.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (pmVar5->super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
      _M_impl.super__Vector_impl_data._M_finish =
           local_48.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (pmVar5->super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_48.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (ppFVar1 != (pointer)0x0) {
        operator_delete(ppFVar1,(long)ppFVar2 - (long)ppFVar1);
        if (local_48.
            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      pFVar6 = std::__detail::
               _Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_50);
    }
    else {
      pFVar6 = (FuncVec *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_false>
                      ._M_cur + 0x10);
    }
  }
  else {
    if (getCalledFunctions(llvm::CallInst_const*)::retval == '\0') {
      getCalledFunctions();
    }
    pFVar6 = &getCalledFunctions::retval;
    if (getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      getCalledFunctions::retval.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           getCalledFunctions::retval.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    if (getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
      _M_realloc_insert<llvm::Function_const*const&>
                ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                 &getCalledFunctions::retval,
                 (iterator)
                 getCalledFunctions::retval.
                 super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(Function **)&local_48);
    }
    else {
      *getCalledFunctions::retval.
       super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
       super__Vector_impl_data._M_finish =
           (Function *)
           local_48.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      getCalledFunctions::retval.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           getCalledFunctions::retval.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_28 = *(Function **)(*(long *)&(local_50->super_CallBase).field_0x28 + 0x38);
    GenericCallGraph<const_llvm::Function_*>::addCall(&this->_cg,&local_28,(Function **)&local_48);
  }
  return pFVar6;
}

Assistant:

const FuncVec &getCalledFunctions(const llvm::CallInst *C) {
        auto *val = _getCalledValue(C);
        if (auto *fun = llvm::dyn_cast<llvm::Function>(val)) {
            static FuncVec retval;
            retval.clear();
            retval.push_back(fun);
            _cg.addCall(C->getParent()->getParent(), fun);
            return retval;
        }

        auto it = _funptrs.find(C);
        if (it != _funptrs.end()) {
            return it->second;
        }

        // FIXME: do not do multiple lookups
        _funptrs[C] = _getCalledFunctions(C);
        return _funptrs[C];
    }